

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 id_00;
  value_type_conflict3 *pvVar1;
  int local_34;
  ImGuiID id;
  ImGuiID seed;
  char *str_end_local;
  char *str_local;
  ImGuiWindow *this_local;
  
  pvVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  if (str_end == (char *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = (int)str_end - (int)str;
  }
  id_00 = ImHash(str,local_34,*pvVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHash(str, str_end ? (int)(str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
    return id;
}